

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

int __thiscall CGraphics_Threaded::Init(CGraphics_Threaded *this)

{
  ulong uVar1;
  long lVar2;
  uchar uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  int iVar7;
  IStorage *pIVar8;
  long *plVar9;
  CConfig *pCVar10;
  IConsole *pIVar11;
  long lVar12;
  IGraphicsBackend *pIVar13;
  CCommandBuffer *this_00;
  uchar *puVar14;
  bool bVar15;
  ulong uVar16;
  ulong uVar17;
  int y;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  long lVar22;
  uchar aNullTextureData [4096];
  
  aNullTextureData[8] = '\0';
  aNullTextureData[9] = '\0';
  aNullTextureData[10] = '\0';
  aNullTextureData[0xb] = '\0';
  aNullTextureData[0xc] = '\0';
  aNullTextureData[0xd] = '\0';
  aNullTextureData[0xe] = '\0';
  aNullTextureData[0xf] = '\0';
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar8 = (IStorage *)
           (**(code **)(**(long **)&this->field_0x8 + 0x10))(*(long **)&this->field_0x8,"storage");
  this->m_pStorage = pIVar8;
  plVar9 = (long *)(**(code **)(**(long **)&this->field_0x8 + 0x10))
                             (*(long **)&this->field_0x8,"config");
  pCVar10 = (CConfig *)(**(code **)(*plVar9 + 0x30))(plVar9);
  this->m_pConfig = pCVar10;
  pIVar11 = (IConsole *)
            (**(code **)(**(long **)&this->field_0x8 + 0x10))(*(long **)&this->field_0x8,"console");
  this->m_pConsole = pIVar11;
  this->m_FirstFreeTexture = 0;
  auVar4 = _DAT_001d4390;
  lVar12 = 0x4806c;
  auVar21 = _DAT_001d4f30;
  do {
    lVar22 = auVar21._8_8_;
    if (SUB164(auVar21 ^ auVar4,4) == -0x80000000 && SUB164(auVar21 ^ auVar4,0) < -0x7ffff001) {
      *(int *)((long)this->m_apCommandBuffers + lVar12 * 4 + -0x6c) = (int)(auVar21._0_8_ + 1);
      *(int *)((long)this->m_apCommandBuffers + lVar12 * 4 + -0x68) = (int)(lVar22 + 1);
    }
    auVar21._0_8_ = auVar21._0_8_ + 2;
    auVar21._8_8_ = lVar22 + 2;
    lVar12 = lVar12 + 2;
  } while (lVar12 != 0x4906c);
  this->m_aTextureIndices[0xfff] = -1;
  pIVar13 = CreateGraphicsBackend();
  this->m_pBackend = pIVar13;
  iVar6 = InitWindow(this);
  iVar7 = -1;
  if (iVar6 == 0) {
    *(float *)&this->field_0x20 =
         (float)*(int *)&this->field_0x10 / (float)this->m_pConfig->m_GfxScreenWidth;
    lVar12 = 0;
    bVar5 = true;
    do {
      bVar15 = bVar5;
      this_00 = (CCommandBuffer *)operator_new(0x30);
      CCommandBuffer::CCommandBuffer(this_00,0x20000,0x200000);
      this->m_apCommandBuffers[lVar12] = this_00;
      lVar12 = 1;
      bVar5 = false;
    } while (bVar15);
    this->m_pCommandBuffer = this->m_apCommandBuffers[0];
    puVar14 = aNullTextureData + 1;
    lVar12 = 0;
    uVar16 = 0;
    do {
      uVar1 = uVar16 * 4;
      uVar17 = 0;
      uVar18 = 0;
      do {
        if (uVar16 < 0x10) {
          if (uVar18 < 0x10) {
            puVar14[uVar17 - 1] = '\x01';
            puVar14[uVar17] = '\0';
          }
          else {
            puVar14[uVar17 - 1] = '\0';
            puVar14[uVar17] = '\x01';
          }
          uVar20 = uVar18 << 7 | uVar1;
          uVar3 = '\0';
          uVar19 = uVar18 << 7;
        }
        else if (uVar18 < 0x10) {
          uVar20 = uVar18 * 0x80 + uVar1;
          (puVar14 + (uVar17 - 1))[0] = '\0';
          (puVar14 + (uVar17 - 1))[1] = '\0';
          uVar3 = '\x01';
          uVar19 = uVar18 * 0x80;
        }
        else {
          uVar20 = lVar12 + uVar17;
          puVar14[uVar17 - 1] = '\0';
          puVar14[uVar17] = '\0';
          uVar3 = '\0';
          uVar19 = uVar17;
        }
        aNullTextureData[uVar20 + 2] = uVar3;
        aNullTextureData[uVar19 + uVar1 + 3] = 0xff;
        uVar18 = uVar18 + 1;
        uVar17 = uVar17 + 0x80;
      } while (uVar17 != 0x1000);
      uVar16 = uVar16 + 1;
      lVar12 = lVar12 + 4;
      puVar14 = puVar14 + 4;
    } while (uVar16 != 0x20);
    iVar6 = (**(code **)(*(long *)this + 0x80))(this,0x20,0x20,1,aNullTextureData,1,9);
    (this->m_InvalidTexture).m_Id = iVar6;
    iVar7 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

int CGraphics_Threaded::Init()
{
	// fetch pointers
	m_pStorage = Kernel()->RequestInterface<IStorage>();
	m_pConfig = Kernel()->RequestInterface<IConfigManager>()->Values();
	m_pConsole = Kernel()->RequestInterface<IConsole>();

	// init textures
	m_FirstFreeTexture = 0;
	for(int i = 0; i < MAX_TEXTURES-1; i++)
		m_aTextureIndices[i] = i+1;
	m_aTextureIndices[MAX_TEXTURES-1] = -1;

	m_pBackend = CreateGraphicsBackend();
	if(InitWindow() != 0)
		return -1;

	m_ScreenHiDPIScale = m_ScreenWidth / (float)m_pConfig->m_GfxScreenWidth;

	// create command buffers
	for(int i = 0; i < NUM_CMDBUFFERS; i++)
		m_apCommandBuffers[i] = new CCommandBuffer(128*1024, 2*1024*1024);
	m_pCommandBuffer = m_apCommandBuffers[0];

	// create null texture, will get id=0
	unsigned char aNullTextureData[4*32*32];
	for(int x = 0; x < 32; ++x)
		for(int y = 0; y < 32; ++y)
		{
			if(x < 16)
			{
				if(y < 16)
				{
					aNullTextureData[4*(y*32+x)+0] = y*8+x*8+15;
					aNullTextureData[4*(y*32+x)+1] = 0;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
				else
				{
					aNullTextureData[4*(y*32+x)+0] = 0;
					aNullTextureData[4*(y*32+x)+1] = y*8+x*8-113;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
			}
			else
			{
				if(y < 16)
				{
					aNullTextureData[4*(y*32+x)+0] = 0;
					aNullTextureData[4*(y*32+x)+1] = 0;
					aNullTextureData[4*(y*32+x)+2] = y*8+x*8-113;
				}
				else
				{
					aNullTextureData[4*(y*32+x)+0] = y*8+x*8-496;
					aNullTextureData[4*(y*32+x)+1] = y*8+x*8-496;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
			}
			aNullTextureData[4*(y*32+x)+3] = 255;
		}

	m_InvalidTexture = LoadTextureRaw(32,32,CImageInfo::FORMAT_RGBA,aNullTextureData,CImageInfo::FORMAT_RGBA,TEXLOAD_NORESAMPLE|TEXLOAD_MULTI_DIMENSION);
	return 0;
}